

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

void LZ4_attach_dictionary(LZ4_stream_t *workingStream,LZ4_stream_t *dictionaryStream)

{
  LZ4_stream_t *local_28;
  LZ4_stream_t *local_20;
  LZ4_stream_t_internal *dictCtx;
  LZ4_stream_t *dictionaryStream_local;
  LZ4_stream_t *workingStream_local;
  
  local_28 = dictionaryStream;
  if (dictionaryStream == (LZ4_stream_t *)0x0) {
    local_28 = (LZ4_stream_t *)0x0;
  }
  local_20 = local_28;
  if (local_28 != (LZ4_stream_t *)0x0) {
    if ((workingStream->internal_donotuse).currentOffset == 0) {
      (workingStream->internal_donotuse).currentOffset = 0x10000;
    }
    if ((local_28->internal_donotuse).dictSize == 0) {
      local_20 = (LZ4_stream_t *)0x0;
    }
  }
  (workingStream->internal_donotuse).dictCtx = (LZ4_stream_t_internal *)local_20;
  return;
}

Assistant:

void LZ4_attach_dictionary(LZ4_stream_t* workingStream, const LZ4_stream_t* dictionaryStream)
{
    const LZ4_stream_t_internal* dictCtx = (dictionaryStream == NULL) ? NULL :
        &(dictionaryStream->internal_donotuse);

    DEBUGLOG(4, "LZ4_attach_dictionary (%p, %p, size %u)",
             workingStream, dictionaryStream,
             dictCtx != NULL ? dictCtx->dictSize : 0);

    if (dictCtx != NULL) {
        /* If the current offset is zero, we will never look in the
         * external dictionary context, since there is no value a table
         * entry can take that indicate a miss. In that case, we need
         * to bump the offset to something non-zero.
         */
        if (workingStream->internal_donotuse.currentOffset == 0) {
            workingStream->internal_donotuse.currentOffset = 64 KB;
        }

        /* Don't actually attach an empty dictionary.
         */
        if (dictCtx->dictSize == 0) {
            dictCtx = NULL;
        }
    }
    workingStream->internal_donotuse.dictCtx = dictCtx;
}